

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

size_t CountWitnessSigOps(CScript *scriptSig,CScript *scriptPubKey,CScriptWitness *witness,
                         uint flags)

{
  long lVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  int iVar5;
  const_iterator witprogram;
  const_iterator witness_00;
  uint in_ECX;
  long in_FS_OFFSET;
  opcodetype opcode;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  const_iterator pc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witnessprogram;
  int witnessversion;
  CScript subscript;
  CScript *in_stack_fffffffffffffec8;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_fffffffffffffed0;
  const_iterator in_stack_fffffffffffffed8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  const_iterator *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  CScriptWitness *in_stack_ffffffffffffff00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined2 in_stack_ffffffffffffff14;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  int *in_stack_ffffffffffffff18;
  CScript *in_stack_ffffffffffffff20;
  CScript *local_78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((CountWitnessSigOps(CScript_const&,CScript_const&,CScriptWitness_const*,unsigned_int)::
       witnessEmpty == '\0') &&
     (iVar5 = __cxa_guard_acquire(&CountWitnessSigOps(CScript_const&,CScript_const&,CScriptWitness_const*,unsigned_int)
                                   ::witnessEmpty), iVar5 != 0)) {
    CScriptWitness::CScriptWitness((CScriptWitness *)in_stack_fffffffffffffec8);
    __cxa_atexit(CScriptWitness::~CScriptWitness,&CountWitnessSigOps::witnessEmpty,&__dso_handle);
    __cxa_guard_release(&CountWitnessSigOps(CScript_const&,CScript_const&,CScriptWitness_const*,unsigned_int)
                         ::witnessEmpty);
  }
  if ((in_ECX & 0x800) == 0) {
    local_78 = (CScript *)0x0;
    goto LAB_00e8f33a;
  }
  if ((in_ECX & 1) == 0) {
    __assert_fail("(flags & SCRIPT_VERIFY_P2SH) != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                  ,0x836,
                  "size_t CountWitnessSigOps(const CScript &, const CScript &, const CScriptWitness *, unsigned int)"
                 );
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffec8);
  bVar2 = CScript::IsWitnessProgram
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT17(in_stack_ffffffffffffff17,
                              CONCAT16(in_stack_ffffffffffffff16,
                                       CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                                      )));
  if (bVar2) {
    local_78 = (CScript *)
               WitnessSigOps(CONCAT13(in_stack_ffffffffffffff17,
                                      CONCAT12(in_stack_ffffffffffffff16,in_stack_ffffffffffffff14))
                             ,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  }
  else {
    uVar3 = CScript::IsPayToScriptHash((CScript *)in_stack_fffffffffffffed8.ptr);
    if (((bool)uVar3) &&
       (uVar4 = CScript::IsPushOnly((CScript *)in_stack_fffffffffffffed8.ptr), (bool)uVar4)) {
      witprogram = prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                             (in_stack_fffffffffffffed0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffec8)
      ;
      while( true ) {
        witness_00 = prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                               (in_stack_fffffffffffffed0);
        bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator<
                          ((const_iterator *)in_stack_fffffffffffffed0,in_stack_fffffffffffffed8);
        if (!bVar2) break;
        CScript::GetOp((CScript *)CONCAT17(bVar2,in_stack_fffffffffffffef8),
                       in_stack_fffffffffffffef0,
                       (opcodetype *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffee0._M_current);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffed0)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffed0)
      ;
      first._M_current._4_4_ = in_stack_fffffffffffffeec;
      first._M_current._0_4_ = in_stack_fffffffffffffee8;
      CScript::
      CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                (in_stack_fffffffffffffec8,first,in_stack_fffffffffffffee0);
      bVar2 = CScript::IsWitnessProgram
                        (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT17(uVar3,CONCAT16(uVar4,CONCAT24(in_stack_ffffffffffffff14,
                                                                in_stack_ffffffffffffff10))));
      if (bVar2) {
        in_stack_fffffffffffffed8.ptr =
             (uchar *)WitnessSigOps(CONCAT13(uVar3,CONCAT12(uVar4,in_stack_ffffffffffffff14)),
                                    witprogram.ptr,witness_00.ptr);
        local_78 = (CScript *)in_stack_fffffffffffffed8.ptr;
      }
      CScript::~CScript(in_stack_fffffffffffffec8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffed8.ptr);
      if (bVar2) goto LAB_00e8f31c;
    }
    local_78 = (CScript *)0x0;
  }
LAB_00e8f31c:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffed8.ptr)
  ;
LAB_00e8f33a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (size_t)local_78;
}

Assistant:

size_t CountWitnessSigOps(const CScript& scriptSig, const CScript& scriptPubKey, const CScriptWitness* witness, unsigned int flags)
{
    static const CScriptWitness witnessEmpty;

    if ((flags & SCRIPT_VERIFY_WITNESS) == 0) {
        return 0;
    }
    assert((flags & SCRIPT_VERIFY_P2SH) != 0);

    int witnessversion;
    std::vector<unsigned char> witnessprogram;
    if (scriptPubKey.IsWitnessProgram(witnessversion, witnessprogram)) {
        return WitnessSigOps(witnessversion, witnessprogram, witness ? *witness : witnessEmpty);
    }

    if (scriptPubKey.IsPayToScriptHash() && scriptSig.IsPushOnly()) {
        CScript::const_iterator pc = scriptSig.begin();
        std::vector<unsigned char> data;
        while (pc < scriptSig.end()) {
            opcodetype opcode;
            scriptSig.GetOp(pc, opcode, data);
        }
        CScript subscript(data.begin(), data.end());
        if (subscript.IsWitnessProgram(witnessversion, witnessprogram)) {
            return WitnessSigOps(witnessversion, witnessprogram, witness ? *witness : witnessEmpty);
        }
    }

    return 0;
}